

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O0

RK_S32 __thiscall mpp_list::flush(mpp_list *this)

{
  mpp_list_node *node_00;
  __sighandler_t in_RDX;
  __sighandler_t extraout_RDX;
  int in_ESI;
  mpp_list_node *node;
  mpp_list *this_local;
  
  if (this->head != (mpp_list_node *)0x0) {
    while (this->count != 0) {
      node_00 = this->head->next;
      mpp_list_del_init(node_00);
      if (this->destroy != (node_destructor)0x0) {
        (*this->destroy)(node_00 + 1);
      }
      free(node_00);
      this->count = this->count + -1;
      in_RDX = extraout_RDX;
    }
  }
  MppMutexCond::signal(&this->super_MppMutexCond,in_ESI,in_RDX);
  return 0;
}

Assistant:

RK_S32 mpp_list::flush()
{
    if (head) {
        while (count) {
            mpp_list_node* node = head->next;
            mpp_list_del_init(node);
            if (destroy) {
                destroy((void*)(node + 1));
            }
            free(node);
            count--;
        }
    }
    signal();
    return 0;
}